

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O1

LY_ERR ly_vlog_build_data_path(ly_ctx *ctx,char **path)

{
  byte *pbVar1;
  bool bVar2;
  long lVar3;
  char *pcVar4;
  lysc_node *plVar5;
  lysc_node *plVar6;
  lys_module *plVar7;
  size_t sVar8;
  size_t sVar9;
  char *pcVar10;
  char *pcVar11;
  lys_module *plVar12;
  int iVar13;
  LY_ERR LVar14;
  lyd_node *node;
  lys_module *plVar15;
  
  *path = (char *)0x0;
  lVar3 = __tls_get_addr();
  iVar13 = *(int *)(lVar3 + 0x24);
  if (iVar13 == 0) {
    node = (lyd_node *)0x0;
LAB_00110afa:
    bVar2 = true;
    LVar14 = LY_SUCCESS;
    if ((*(int *)(lVar3 + 0x14) == 0) ||
       (pbVar1 = *(byte **)(*(long *)(lVar3 + 0x18) + (ulong)(*(int *)(lVar3 + 0x14) - 1) * 8),
       LVar14 = LY_SUCCESS, (*pbVar1 & 0x82) != 0)) goto LAB_00110bb3;
    plVar5 = lysc_data_node(*(lysc_node **)(pbVar1 + 0x10));
    plVar6 = lyd_node_schema(node);
    if (plVar5 != plVar6) goto LAB_00110bb3;
    plVar15 = *(lys_module **)(pbVar1 + 8);
    plVar7 = lyd_node_module(node);
    sVar8 = 0;
    plVar12 = (lys_module *)0x0;
    if (plVar7 != plVar15) {
      plVar12 = plVar15;
    }
    pcVar4 = *path;
    if (pcVar4 != (char *)0x0) {
      sVar8 = strlen(pcVar4);
    }
    if (plVar12 == (lys_module *)0x0) {
      iVar13 = 0;
    }
    else {
      sVar9 = strlen(plVar12->name);
      iVar13 = (int)sVar9 + 1;
    }
    sVar9 = strlen(*(char **)(pbVar1 + 0x28));
    pcVar4 = (char *)realloc(pcVar4,(ulong)((int)sVar9 + iVar13 + (int)sVar8 + 2));
    if (pcVar4 != (char *)0x0) {
      *path = pcVar4;
      if (plVar12 == (lys_module *)0x0) {
        pcVar10 = "";
        pcVar11 = "";
      }
      else {
        pcVar11 = plVar12->name;
        pcVar10 = ":";
      }
      LVar14 = LY_SUCCESS;
      sprintf(pcVar4 + (sVar8 & 0xffffffff),"/%s%s%s",pcVar11,pcVar10,*(undefined8 *)(pbVar1 + 0x28)
             );
      goto LAB_00110bb3;
    }
    if (node->schema == (lysc_node *)0x0) {
      plVar15 = (lys_module *)&node[2].schema;
    }
    else {
      plVar15 = node->schema->module;
    }
    ctx = plVar15->ctx;
    pcVar4 = "ly_vlog_build_path_append";
  }
  else {
    node = *(lyd_node **)(*(long *)(lVar3 + 0x28) + (ulong)(iVar13 - 1) * 8);
    if (node == (lyd_node *)0x0) {
      if (iVar13 != 1) {
        __assert_fail("log_location.dnodes.count == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/log.c"
                      ,0x300,"LY_ERR ly_vlog_build_data_path(const struct ly_ctx *, char **)");
      }
      pcVar4 = strdup("/");
      *path = pcVar4;
      if (pcVar4 != (char *)0x0) {
        LVar14 = LY_SUCCESS;
        bVar2 = true;
        goto LAB_00110bb3;
      }
    }
    else {
      if (node->parent == (lyd_node_inner *)0x0) {
        if (node->schema == (lysc_node *)0x0) {
          plVar5 = (lysc_node *)0x0;
        }
        else {
          plVar5 = node->schema->parent;
        }
        plVar5 = lysc_data_node(plVar5);
        if (plVar5 == (lysc_node *)0x0) goto LAB_00110a7a;
        pcVar4 = lyd_path_set((ly_set *)(lVar3 + 0x20),LYD_PATH_STD);
      }
      else {
LAB_00110a7a:
        pcVar4 = lyd_path(*(lyd_node **)
                           (*(long *)(lVar3 + 0x28) + (ulong)(*(int *)(lVar3 + 0x24) - 1) * 8),
                          LYD_PATH_STD,(char *)0x0,0);
      }
      *path = pcVar4;
      if (pcVar4 != (char *)0x0) goto LAB_00110afa;
    }
    pcVar4 = "ly_vlog_build_data_path";
  }
  bVar2 = false;
  LVar14 = LY_EMEM;
  ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",pcVar4);
LAB_00110bb3:
  if (!bVar2) {
    free(*path);
    *path = (char *)0x0;
  }
  return LVar14;
}

Assistant:

LY_ERR
ly_vlog_build_data_path(const struct ly_ctx *ctx, char **path)
{
    LY_ERR rc = LY_SUCCESS;
    const struct lyd_node *dnode = NULL;

    *path = NULL;

    if (log_location.dnodes.count) {
        dnode = log_location.dnodes.objs[log_location.dnodes.count - 1];
        if (!dnode) {
            /* special root node */
            assert(log_location.dnodes.count == 1);
            *path = strdup("/");
            LY_CHECK_ERR_GOTO(!*path, LOGMEM(ctx); rc = LY_EMEM, cleanup);
            goto cleanup;
        }

        if (dnode->parent || !lysc_data_parent(dnode->schema)) {
            /* data node with all of its parents */
            *path = lyd_path(log_location.dnodes.objs[log_location.dnodes.count - 1], LYD_PATH_STD, NULL, 0);
            LY_CHECK_ERR_GOTO(!*path, LOGMEM(ctx); rc = LY_EMEM, cleanup);
        } else {
            /* data parsers put all the parent nodes in the set, but they are not connected */
            *path = lyd_path_set(&log_location.dnodes, LYD_PATH_STD);
            LY_CHECK_ERR_GOTO(!*path, LOGMEM(ctx); rc = LY_EMEM, cleanup);
        }
    }

    /* sometimes the last node is not created yet and we only have the schema node */
    if (log_location.scnodes.count) {
        rc = ly_vlog_build_path_append(path, log_location.scnodes.objs[log_location.scnodes.count - 1], dnode);
        LY_CHECK_GOTO(rc, cleanup);
    }

cleanup:
    if (rc) {
        free(*path);
        *path = NULL;
    }
    return rc;
}